

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O0

PClassActor * P_GetSpawnableType(int spawnnum)

{
  bool bVar1;
  PClassActor *pPVar2;
  PClassActor **ppPVar3;
  PClassActor **type;
  FName local_18;
  int local_14;
  FName spawnname;
  int spawnnum_local;
  
  local_14 = spawnnum;
  if (spawnnum < 0) {
    FName::FName(&local_18,-spawnnum);
    bVar1 = FName::IsValidName(&local_18);
    if (bVar1) {
      FName::FName((FName *)((long)&type + 4),&local_18);
      pPVar2 = PClass::FindActor((FName *)((long)&type + 4));
      return pPVar2;
    }
  }
  else {
    ppPVar3 = TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>::CheckKey
                        (&SpawnableThings,spawnnum);
    if (ppPVar3 != (PClassActor **)0x0) {
      return *ppPVar3;
    }
  }
  return (PClassActor *)0x0;
}

Assistant:

PClassActor *P_GetSpawnableType(int spawnnum)
{
	if (spawnnum < 0)
	{ // A named arg from a UDMF map
		FName spawnname = FName(ENamedName(-spawnnum));
		if (spawnname.IsValidName())
		{
			return PClass::FindActor(spawnname);
		}
	}
	else
	{ // A numbered arg from a Hexen or UDMF map
		PClassActor **type = SpawnableThings.CheckKey(spawnnum);
		if (type != NULL)
		{
			return *type;
		}
	}
	return NULL;
}